

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

string_t duckdb::StringValueScanner::RemoveEscape
                   (char *str_ptr,idx_t end,char escape,char quote,bool strict_mode,Vector *vector)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  idx_t iVar4;
  idx_t iVar5;
  undefined7 in_register_00000011;
  char *pcVar6;
  Vector *vector_00;
  bool bVar7;
  char cVar8;
  string_t sVar9;
  string_t removed_escapes;
  undefined1 local_38 [16];
  
  iVar5 = CONCAT71(in_register_00000011,escape);
  if (end == 0) {
    vector_00 = (Vector *)0x0;
  }
  else {
    vector_00 = (Vector *)0x0;
    iVar5 = 0;
    iVar4 = 0;
    pcVar6 = str_ptr;
    do {
      if ((str_ptr[iVar4] != escape) ||
         (pcVar6 = (char *)CONCAT71((int7)((ulong)pcVar6 >> 8),1), (iVar5 & 1) != 0)) {
        if (str_ptr[iVar4] == quote) {
          vector_00 = (Vector *)(&vector_00->vector_type + (byte)((byte)iVar5 | !strict_mode));
        }
        else {
          vector_00 = (Vector *)&vector_00->field_0x1;
        }
        pcVar6 = (char *)0x0;
      }
      iVar4 = iVar4 + 1;
      iVar5 = (ulong)pcVar6 & 0xffffffff;
    } while (end != iVar4);
  }
  local_38 = (undefined1  [16])StringVector::EmptyString((StringVector *)vector,vector_00,iVar5);
  uVar2 = local_38._0_8_;
  pcVar6 = (char *)local_38._8_8_;
  if ((uint)local_38._0_4_ < 0xd) {
    pcVar6 = local_38 + 4;
  }
  if (end != 0) {
    lVar3 = 0;
    iVar5 = 0;
    bVar7 = false;
    do {
      cVar8 = str_ptr[iVar5];
      if ((cVar8 != escape) || (bVar1 = true, bVar7)) {
        if ((cVar8 != quote) || (cVar8 = quote, bVar7 || !strict_mode)) {
          pcVar6[lVar3] = cVar8;
          lVar3 = lVar3 + 1;
        }
        bVar1 = false;
      }
      bVar7 = bVar1;
      iVar5 = iVar5 + 1;
    } while (end != iVar5);
    uVar2 = (ulong)(uint)local_38._0_4_;
  }
  if ((uint)uVar2 < 0xd) {
    switchD_01043a80::default(local_38 + 4 + (uVar2 & 0xffffffff),0,0xc - (uVar2 & 0xffffffff));
  }
  else {
    local_38._4_4_ = *(undefined4 *)local_38._8_8_;
  }
  sVar9.value.pointer.ptr = (char *)local_38._8_8_;
  sVar9.value._0_8_ = local_38._0_8_;
  return (string_t)sVar9.value;
}

Assistant:

string_t StringValueScanner::RemoveEscape(const char *str_ptr, idx_t end, char escape, char quote, bool strict_mode,
                                          Vector &vector) {
	// Figure out the exact size
	idx_t str_pos = 0;
	bool just_escaped = false;
	for (idx_t cur_pos = 0; cur_pos < end; cur_pos++) {
		if (str_ptr[cur_pos] == escape && !just_escaped) {
			just_escaped = true;
		} else if (str_ptr[cur_pos] == quote) {
			if (just_escaped || !strict_mode) {
				str_pos++;
			}
			just_escaped = false;
		} else {
			just_escaped = false;
			str_pos++;
		}
	}

	auto removed_escapes = StringVector::EmptyString(vector, str_pos);
	auto removed_escapes_ptr = removed_escapes.GetDataWriteable();
	// Allocate string and copy it
	str_pos = 0;
	just_escaped = false;
	for (idx_t cur_pos = 0; cur_pos < end; cur_pos++) {
		const char c = str_ptr[cur_pos];
		if (c == escape && !just_escaped) {
			just_escaped = true;
		} else if (str_ptr[cur_pos] == quote) {
			if (just_escaped || !strict_mode) {
				removed_escapes_ptr[str_pos++] = c;
			}
			just_escaped = false;
		} else {
			just_escaped = false;
			removed_escapes_ptr[str_pos++] = c;
		}
	}
	removed_escapes.Finalize();
	return removed_escapes;
}